

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_modules(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  ostream *poVar2;
  option_group_definition rand_options;
  allocator local_14a;
  allocator local_149;
  string local_148 [32];
  string local_128;
  string local_108;
  option_group_definition local_e8;
  undefined1 local_b0 [160];
  
  std::__cxx11::string::string((string *)&local_108,"Randomization options",(allocator *)local_b0);
  VW::config::option_group_definition::option_group_definition(&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string((string *)&local_128,"random_seed",&local_149);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_b0,&local_128,&all->random_seed);
  std::__cxx11::string::string(local_148,"seed random number generator",&local_14a);
  std::__cxx11::string::_M_assign((string *)(local_b0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_e8,(typed_option<unsigned_long> *)local_b0);
  std::__cxx11::string::~string(local_148);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_b0);
  std::__cxx11::string::~string((string *)&local_128);
  (**options->_vptr_options_i)(options,&local_e8);
  all->random_state = all->random_seed;
  parse_feature_tweaks(options,all);
  parse_example_tweaks(options,all);
  parse_output_model(options,all);
  parse_output_preds(options,all);
  parse_reductions(options,all);
  if (all->quiet == false) {
    pvVar1 = &all->trace_message;
    poVar2 = std::operator<<(&pvVar1->super_ostream,"Num weight bits = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(&pvVar1->super_ostream,"learning rate = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,all->eta);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<(&pvVar1->super_ostream,"initial_t = ");
    poVar2 = std::ostream::_M_insert<double>(all->sd->t);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(&pvVar1->super_ostream,"power_t = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,all->power_t);
    std::endl<char,std::char_traits<char>>(poVar2);
    if (1 < all->numpasses) {
      poVar2 = std::operator<<(&pvVar1->super_ostream,"decay_learning_rate = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,all->eta_decay_rate);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  VW::config::option_group_definition::~option_group_definition(&local_e8);
  return;
}

Assistant:

void parse_modules(options_i& options, vw& all)
{
  option_group_definition rand_options("Randomization options");
  rand_options.add(make_option("random_seed", all.random_seed).help("seed random number generator"));
  options.add_and_parse(rand_options);
  all.random_state = all.random_seed;

  parse_feature_tweaks(options, all);  // feature tweaks

  parse_example_tweaks(options, all);  // example manipulation

  parse_output_model(options, all);

  parse_output_preds(options, all);

  parse_reductions(options, all);

  if (!all.quiet)
  {
    all.trace_message << "Num weight bits = " << all.num_bits << endl;
    all.trace_message << "learning rate = " << all.eta << endl;
    all.trace_message << "initial_t = " << all.sd->t << endl;
    all.trace_message << "power_t = " << all.power_t << endl;
    if (all.numpasses > 1)
      all.trace_message << "decay_learning_rate = " << all.eta_decay_rate << endl;
  }
}